

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

void adios2::helper::(anonymous_namespace)::SetOption<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               string *nodeName,Node *upperNode,string *hint,bool mandatory)

{
  string sStack_a8;
  Node node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&sStack_a8,(string *)nodeName);
  anon_unknown_0::YAMLNode(&node,&sStack_a8,upperNode,hint,mandatory,Scalar);
  std::__cxx11::string::~string((string *)&sStack_a8);
  if ((node.m_isValid == true) &&
     ((node.m_pNode == (node *)0x0 ||
      ((((((node.m_pNode)->m_pRef).
          super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_pData).
        super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_isDefined
       == true)))) {
    YAML::Node::as<std::__cxx11::string>(&local_48,&node);
    std::__cxx11::string::operator=((string *)value,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  YAML::Node::~Node(&node);
  return;
}

Assistant:

void SetOption(T &value, const std::string nodeName, const YAML::Node &upperNode,
               const std::string &hint, bool mandatory = isNotMandatory)
{
    auto node = YAMLNode(nodeName, upperNode, hint, mandatory, YAML::NodeType::Scalar);
    if (node)
    {
        value = node.as<T>();
    }
}